

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystemDescriptor.cpp
# Opt level: O1

void __thiscall
chrono::ChSystemDescriptor::ConvertToMatrixForm
          (ChSystemDescriptor *this,ChSparseMatrix *Z,ChVectorDynamic<> *rhs)

{
  double *pdVar1;
  double *pdVar2;
  pointer ppCVar3;
  pointer ppCVar4;
  pointer ppCVar5;
  pointer ppCVar6;
  pointer ppCVar7;
  pointer ppCVar8;
  ChVariables *pCVar9;
  ChKblock *pCVar10;
  ChConstraint *pCVar11;
  double *pdVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  int iVar20;
  uint uVar21;
  Index size;
  long lVar22;
  ulong uVar23;
  long lVar24;
  uint uVar25;
  ulong uVar26;
  ActualDstType actualDst;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  long lVar30;
  long lVar31;
  int iVar32;
  ChVectorRef local_48;
  
  ppCVar3 = (this->vvariables).
            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppCVar4 = (this->vvariables).
            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppCVar5 = (this->vconstraints).
            super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppCVar6 = (this->vconstraints).
            super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  lVar22 = (long)ppCVar6 - (long)ppCVar5 >> 3;
  if (ppCVar6 == ppCVar5) {
    iVar32 = 0;
  }
  else {
    lVar24 = 0;
    iVar32 = 0;
    do {
      iVar32 = iVar32 + (uint)ppCVar5[lVar24]->active;
      lVar24 = lVar24 + 1;
    } while (lVar22 + (ulong)(lVar22 == 0) != lVar24);
  }
  ppCVar7 = (this->vstiffness).
            super__Vector_base<chrono::ChKblock_*,_std::allocator<chrono::ChKblock_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppCVar8 = (this->vstiffness).
            super__Vector_base<chrono::ChKblock_*,_std::allocator<chrono::ChKblock_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar24 = (long)ppCVar3 - (long)ppCVar4 >> 3;
  iVar20 = (*this->_vptr_ChSystemDescriptor[7])(this);
  this->n_q = iVar20;
  if (Z != (ChSparseMatrix *)0x0) {
    Eigen::SparseMatrix<double,_1,_int>::conservativeResize
              (Z,(long)(iVar20 + iVar32),(long)(iVar20 + iVar32));
    Eigen::SparseMatrix<double,_1,_int>::setZeroValues(Z);
    if (ppCVar3 != ppCVar4) {
      lVar30 = 0;
      uVar23 = 0;
      do {
        pCVar9 = (this->vvariables).
                 super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar30];
        if (pCVar9->disabled == false) {
          (*pCVar9->_vptr_ChVariables[9])(this->c_a,pCVar9,Z,uVar23,uVar23);
          iVar20 = (*(this->vvariables).
                     super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar30]->_vptr_ChVariables[2])();
          uVar23 = (ulong)(uint)((int)uVar23 + iVar20);
        }
        lVar30 = lVar30 + 1;
      } while (lVar24 + (ulong)(lVar24 == 0) != lVar30);
    }
    if (ppCVar7 != ppCVar8) {
      lVar31 = (long)ppCVar7 - (long)ppCVar8 >> 3;
      lVar30 = 0;
      do {
        pCVar10 = (this->vstiffness).
                  super__Vector_base<chrono::ChKblock_*,_std::allocator<chrono::ChKblock_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[lVar30];
        (*pCVar10->_vptr_ChKblock[6])(pCVar10,Z,1);
        lVar30 = lVar30 + 1;
      } while (lVar31 + (ulong)(lVar31 == 0) != lVar30);
    }
    if (ppCVar6 != ppCVar5) {
      lVar30 = 0;
      iVar20 = 0;
      do {
        pCVar11 = (this->vconstraints).
                  super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar30];
        if (pCVar11->active == true) {
          (*pCVar11->_vptr_ChConstraint[0xd])(pCVar11,Z,(ulong)(uint)(this->n_q + iVar20));
          pCVar11 = (this->vconstraints).
                    super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar30];
          (*pCVar11->_vptr_ChConstraint[0xe])(pCVar11,Z,(ulong)(uint)(this->n_q + iVar20));
          uVar25 = this->n_q + iVar20;
          (**Z->_vptr_SparseMatrix)
                    ((this->vconstraints).
                     super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar30]->cfm_i,Z,(ulong)uVar25,
                     (ulong)uVar25,1);
          iVar20 = iVar20 + 1;
        }
        lVar30 = lVar30 + 1;
      } while (lVar22 + (ulong)(lVar22 == 0) != lVar30);
    }
  }
  if (rhs != (ChVectorDynamic<> *)0x0) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
               (long)iVar32 + (long)this->n_q,1);
    lVar30 = (rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
    if (lVar30 < 0) {
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    if (lVar30 != 0) {
      memset((rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data,
             0,lVar30 << 3);
    }
    if (ppCVar3 != ppCVar4) {
      lVar30 = 0;
      uVar25 = 0;
      do {
        ppCVar3 = (this->vvariables).
                  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (ppCVar3[lVar30]->disabled == false) {
          ChVariables::Get_fb(&local_48,ppCVar3[lVar30]);
          uVar21 = (*(this->vvariables).
                     super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar30]->_vptr_ChVariables[2])();
          pdVar12 = (rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                    m_data;
          if ((int)uVar21 < 0 && pdVar12 != (double *)0x0) {
            __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                          ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                          "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, Level = 0]"
                         );
          }
          uVar23 = (ulong)(int)uVar21;
          if (((int)(uVar21 | uVar25) < 0) ||
             ((long)((rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                     .m_rows - uVar23) < (long)(int)uVar25)) {
            __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                          ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                          "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                         );
          }
          if (local_48.
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
              ._8_8_ != uVar23) {
            __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                          ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                          "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>]"
                         );
          }
          pdVar12 = pdVar12 + (int)uVar25;
          uVar26 = uVar23;
          if ((((ulong)pdVar12 & 7) == 0) &&
             (uVar26 = (ulong)(-((uint)((ulong)pdVar12 >> 3) & 0x1fffffff) & 7),
             (long)uVar23 <= (long)uVar26)) {
            uVar26 = uVar23;
          }
          uVar28 = uVar23 - uVar26;
          uVar27 = uVar28 + 7;
          if (-1 < (long)uVar28) {
            uVar27 = uVar28;
          }
          if (0 < (long)uVar26) {
            uVar29 = 0;
            do {
              pdVar12[uVar29] =
                   *(double *)
                    (local_48.
                     super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                     ._0_8_ + uVar29 * 8);
              uVar29 = uVar29 + 1;
            } while (uVar26 != uVar29);
          }
          uVar27 = (uVar27 & 0xfffffffffffffff8) + uVar26;
          if (7 < (long)uVar28) {
            do {
              pdVar1 = (double *)
                       (local_48.
                        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                        ._0_8_ + uVar26 * 8);
              dVar13 = pdVar1[1];
              dVar14 = pdVar1[2];
              dVar15 = pdVar1[3];
              dVar16 = pdVar1[4];
              dVar17 = pdVar1[5];
              dVar18 = pdVar1[6];
              dVar19 = pdVar1[7];
              pdVar2 = pdVar12 + uVar26;
              *pdVar2 = *pdVar1;
              pdVar2[1] = dVar13;
              pdVar2[2] = dVar14;
              pdVar2[3] = dVar15;
              pdVar2[4] = dVar16;
              pdVar2[5] = dVar17;
              pdVar2[6] = dVar18;
              pdVar2[7] = dVar19;
              uVar26 = uVar26 + 8;
            } while ((long)uVar26 < (long)uVar27);
          }
          if ((long)uVar27 < (long)uVar23) {
            do {
              pdVar12[uVar27] =
                   *(double *)
                    (local_48.
                     super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                     ._0_8_ + uVar27 * 8);
              uVar27 = uVar27 + 1;
            } while (uVar23 != uVar27);
          }
          iVar32 = (*(this->vvariables).
                     super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar30]->_vptr_ChVariables[2])();
          uVar25 = uVar25 + iVar32;
        }
        lVar30 = lVar30 + 1;
      } while (lVar30 != lVar24 + (ulong)(lVar24 == 0));
    }
    if (ppCVar6 != ppCVar5) {
      ppCVar5 = (this->vconstraints).
                super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      iVar32 = this->n_q;
      lVar24 = 0;
      iVar20 = 0;
      do {
        pCVar11 = ppCVar5[lVar24];
        if (pCVar11->active == true) {
          lVar30 = (long)iVar20 + (long)iVar32;
          if (((int)lVar30 < 0) ||
             ((rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
              <= lVar30)) {
            __assert_fail("index >= 0 && index < size()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                         );
          }
          (rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
          [lVar30] = -pCVar11->b_i;
          iVar20 = iVar20 + 1;
        }
        lVar24 = lVar24 + 1;
      } while (lVar22 + (ulong)(lVar22 == 0) != lVar24);
    }
  }
  return;
}

Assistant:

void ChSystemDescriptor::ConvertToMatrixForm(ChSparseMatrix* Z, ChVectorDynamic<>* rhs) {
    std::vector<ChConstraint*>& mconstraints = GetConstraintsList();
    std::vector<ChVariables*>& mvariables = GetVariablesList();

    auto mv_size = mvariables.size();
    auto mc_size = mconstraints.size();
    auto vs_size = vstiffness.size();

    // Count constraints.
    int mn_c = 0;
    for (size_t ic = 0; ic < mc_size; ic++) {
        if (mconstraints[ic]->IsActive())
            mn_c++;
    }

    // Count active variables, by scanning through all variable blocks, and set offsets.
    n_q = CountActiveVariables();

    if (Z) {
        Z->conservativeResize(n_q + mn_c, n_q + mn_c);
        Z->setZeroValues();        

        // Fill Z with masses and inertias.
        int s_q = 0;
        for (size_t iv = 0; iv < mv_size; iv++) {
            if (mvariables[iv]->IsActive()) {
                // Masses and inertias in upper-left block of Z
                mvariables[iv]->Build_M(*Z, s_q, s_q, c_a);
                s_q += mvariables[iv]->Get_ndof();
            }
        }

        // If present, add stiffness matrix K to upper-left block of Z.
        for (size_t ik = 0; ik < vs_size; ik++) {
            vstiffness[ik]->Build_K(*Z, true);
        }

        // Fill Z by looping over constraints.
        int s_c = 0;
        for (size_t ic = 0; ic < mc_size; ic++) {
            if (mconstraints[ic]->IsActive()) {
                // Constraint Jacobian in lower-left block of Z
                mconstraints[ic]->Build_Cq(*Z, n_q + s_c);
                // Transposed constraint Jacobian in upper-right block of Z
                mconstraints[ic]->Build_CqT(*Z, n_q + s_c);
                // E ( = cfm ) in lower-right block of Z
                Z->SetElement(n_q + s_c, n_q + s_c, mconstraints[ic]->Get_cfm_i());
                s_c++;
            }
        }
    }

    if (rhs) {
        rhs->setZero(n_q + mn_c, 1);

        // Fill rhs with forces.
        int s_q = 0;
        for (size_t iv = 0; iv < mv_size; iv++) {
            if (mvariables[iv]->IsActive()) {
                // Forces in upper section of rhs
                rhs->segment(s_q, vvariables[iv]->Get_ndof()) = vvariables[iv]->Get_fb();
                s_q += mvariables[iv]->Get_ndof();
            }
        }

        // Fill rhs by looping over constraints.
        int s_c = 0;
        for (size_t ic = 0; ic < mc_size; ic++) {
            if (mconstraints[ic]->IsActive()) {
                // -b term in lower section of rhs
                (*rhs)(n_q + s_c) = -(mconstraints[ic]->Get_b_i());
                s_c++;
            }
        }
    }
}